

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void VW::setup_example(vw *all,example *ae)

{
  uchar **ppuVar1;
  byte bVar2;
  parser *ppVar3;
  byte *pbVar4;
  unsigned_long *puVar5;
  example_predict *peVar6;
  example *peVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint32_t *puVar12;
  size_t sVar13;
  unsigned_long *puVar14;
  example *__range1;
  byte *pbVar15;
  float fVar16;
  float new_features_sum_feat_sq;
  size_t new_features_cnt;
  example *local_38;
  float local_2c;
  size_t local_28;
  
  local_38 = ae;
  if ((all->p->sort_features == true) && (ae->sorted == false)) {
    unique_sort_features(all->parse_mask,ae);
  }
  ppVar3 = all->p;
  if (ppVar3->write_cache == true) {
    (*(ppVar3->lp).cache_label)(&ae->l,ppVar3->output);
    cache_features(all->p->output,ae,all->parse_mask);
  }
  ae->partial_prediction = 0.0;
  uVar9 = 0;
  ae->num_features = 0;
  ae->loss = 0.0;
  ae->total_sum_feat_sq = 0.0;
  ae->example_counter = all->p->end_parsed_examples;
  if (all->p->emptylines_separate_examples == false) {
    puVar12 = &all->p->in_pass_counter;
    *puVar12 = *puVar12 + 1;
  }
  uVar11 = all->holdout_period - 1;
  if (all->p->emptylines_separate_examples == false) {
    uVar11 = uVar9;
  }
  if (all->holdout_set_off == false) {
    uVar9 = all->p->in_pass_counter;
    if (all->holdout_after == 0) {
      uVar9 = (uint)(uVar9 % all->holdout_period == uVar11);
    }
    else {
      uVar9 = (uint)(all->holdout_after < uVar9);
    }
  }
  ae->test_only = SUB41(uVar9,0);
  bVar8 = (*(all->p->lp).test_label)(&ae->l);
  ae->test_only = (bool)(ae->test_only | bVar8);
  if (((all->p->emptylines_separate_examples == true) && ((ae->tag)._end == (ae->tag)._begin)) &&
     ((ae->super_example_predict).indices._end == (ae->super_example_predict).indices._begin)) {
    puVar12 = &all->p->in_pass_counter;
    *puVar12 = *puVar12 + 1;
  }
  fVar16 = (*(all->p->lp).get_weight)(&ae->l);
  ae->weight = fVar16;
  if ((all->ignore_some == true) &&
     (pbVar15 = (ae->super_example_predict).indices._begin,
     pbVar15 != (local_38->super_example_predict).indices._end)) {
    do {
      peVar6 = &local_38->super_example_predict;
      if (all->ignore[*pbVar15] == true) {
        features::clear((local_38->super_example_predict).feature_space + *pbVar15);
        memmove(pbVar15,pbVar15 + 1,(long)(peVar6->indices)._end - (long)(pbVar15 + 1));
        ppuVar1 = &(local_38->super_example_predict).indices._end;
        *ppuVar1 = *ppuVar1 + -1;
        pbVar15 = pbVar15 + -1;
      }
      pbVar15 = pbVar15 + 1;
    } while (pbVar15 != (local_38->super_example_predict).indices._end);
  }
  if ((all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    generateGrams(all,&local_38);
  }
  if (all->add_constant == true) {
    add_constant_feature(all,local_38);
  }
  if ((all->limit_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (all->limit_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    feature_limit(all,local_38);
  }
  peVar7 = local_38;
  puVar12 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar12 = &(all->weights).sparse_weights._stride_shift;
  }
  lVar10 = (ulong)all->wpp << ((byte)*puVar12 & 0x3f);
  if (lVar10 != 1) {
    pbVar4 = (local_38->super_example_predict).indices._end;
    for (pbVar15 = (local_38->super_example_predict).indices._begin; pbVar15 != pbVar4;
        pbVar15 = pbVar15 + 1) {
      puVar5 = (local_38->super_example_predict).feature_space[*pbVar15].indicies._end;
      for (puVar14 = (local_38->super_example_predict).feature_space[*pbVar15].indicies._begin;
          puVar14 != puVar5; puVar14 = puVar14 + 1) {
        *puVar14 = *puVar14 * lVar10;
      }
    }
  }
  local_38->num_features = 0;
  local_38->total_sum_feat_sq = 0.0;
  pbVar15 = (local_38->super_example_predict).indices._begin;
  pbVar4 = (local_38->super_example_predict).indices._end;
  if (pbVar15 != pbVar4) {
    sVar13 = local_38->num_features;
    fVar16 = local_38->total_sum_feat_sq;
    do {
      bVar2 = *pbVar15;
      sVar13 = sVar13 + ((long)(local_38->super_example_predict).feature_space[bVar2].values._end -
                         (long)(local_38->super_example_predict).feature_space[bVar2].values._begin
                        >> 2);
      local_38->num_features = sVar13;
      fVar16 = fVar16 + (local_38->super_example_predict).feature_space[bVar2].sum_feat_sq;
      local_38->total_sum_feat_sq = fVar16;
      pbVar15 = pbVar15 + 1;
    } while (pbVar15 != pbVar4);
  }
  INTERACTIONS::eval_count_of_generated_ft(all,local_38,&local_28,&local_2c);
  peVar7->num_features = peVar7->num_features + local_28;
  peVar7->total_sum_feat_sq = local_2c + peVar7->total_sum_feat_sq;
  return;
}

Assistant:

void setup_example(vw& all, example* ae)
{
  if (all.p->sort_features && ae->sorted == false)
    unique_sort_features(all.parse_mask, ae);

  if (all.p->write_cache)
  {
    all.p->lp.cache_label(&ae->l, *(all.p->output));
    cache_features(*(all.p->output), ae, all.parse_mask);
  }

  ae->partial_prediction = 0.;
  ae->num_features = 0;
  ae->total_sum_feat_sq = 0;
  ae->loss = 0.;

  ae->example_counter = (size_t)(all.p->end_parsed_examples);
  if (!all.p->emptylines_separate_examples)
    all.p->in_pass_counter++;

  ae->test_only = is_test_only(all.p->in_pass_counter, all.holdout_period, all.holdout_after, all.holdout_set_off,
      all.p->emptylines_separate_examples ? (all.holdout_period - 1) : 0);
  ae->test_only |= all.p->lp.test_label(&ae->l);

  if (all.p->emptylines_separate_examples && example_is_newline(*ae))
    all.p->in_pass_counter++;

  ae->weight = all.p->lp.get_weight(&ae->l);

  if (all.ignore_some)
    for (unsigned char* i = ae->indices.begin(); i != ae->indices.end(); i++)
      if (all.ignore[*i])
      {
        // delete namespace
        ae->feature_space[*i].clear();
        memmove(i, i + 1, (ae->indices.end() - (i + 1)) * sizeof(*i));
        ae->indices.end()--;
        i--;
      }

  if (all.ngram_strings.size() > 0)
    generateGrams(all, ae);

  if (all.add_constant)  // add constant feature
    VW::add_constant_feature(all, ae);

  if (all.limit_strings.size() > 0)
    feature_limit(all, ae);

  uint64_t multiplier = (uint64_t)all.wpp << all.weights.stride_shift();

  if (multiplier != 1)  // make room for per-feature information.
    for (features& fs : *ae)
      for (auto& j : fs.indicies) j *= multiplier;
  ae->num_features = 0;
  ae->total_sum_feat_sq = 0;
  for (features& fs : *ae)
  {
    ae->num_features += fs.size();
    ae->total_sum_feat_sq += fs.sum_feat_sq;
  }

  size_t new_features_cnt;
  float new_features_sum_feat_sq;
  INTERACTIONS::eval_count_of_generated_ft(all, *ae, new_features_cnt, new_features_sum_feat_sq);
  ae->num_features += new_features_cnt;
  ae->total_sum_feat_sq += new_features_sum_feat_sq;
}